

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86.cpp
# Opt level: O0

int __thiscall ncnn::Bias_x86::forward_inplace(Bias_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  float *pfVar2;
  long in_RSI;
  long *in_RDI;
  __m128 _outp;
  __m128 _p;
  __m128 _bias;
  int i;
  float bias;
  float *ptr;
  int q;
  float *bias_ptr;
  int size;
  int channels;
  int d;
  int h;
  int w;
  undefined8 in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  int local_fc;
  Mat local_e8;
  float *local_a0;
  int local_94;
  float *local_90;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float *pfStack_40;
  Mat *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_74 = *(int *)(in_RSI + 0x2c);
  local_78 = *(int *)(in_RSI + 0x30);
  local_7c = *(int *)(in_RSI + 0x34);
  local_80 = *(int *)(in_RSI + 0x38);
  local_84 = local_74 * local_78 * local_7c;
  local_90 = Mat::operator_cast_to_float_((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8))
  ;
  for (local_94 = 0; local_94 < local_80; local_94 = local_94 + 1) {
    Mat::channel(in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
    pfVar2 = Mat::operator_cast_to_float_(&local_e8);
    Mat::~Mat((Mat *)0x1a0bde);
    local_58 = local_90[local_94];
    in_stack_fffffffffffffee8 = (Mat *)CONCAT44(local_58,local_58);
    local_a0 = pfVar2;
    for (local_fc = 0; local_fc + 3 < local_84; local_fc = local_fc + 4) {
      pfStack_40 = local_a0;
      uVar1 = *(undefined8 *)local_a0;
      in_stack_fffffffffffffee0 = *(undefined8 *)(local_a0 + 2);
      local_28._0_4_ = (float)uVar1;
      local_28._4_4_ = (float)((ulong)uVar1 >> 0x20);
      uStack_20._0_4_ = (float)in_stack_fffffffffffffee0;
      uStack_20._4_4_ = (float)((ulong)in_stack_fffffffffffffee0 >> 0x20);
      local_8 = local_a0;
      local_18 = CONCAT44(local_28._4_4_ + local_58,(float)local_28 + local_58);
      uStack_10 = CONCAT44(uStack_20._4_4_ + local_58,(float)uStack_20 + local_58);
      *(undefined8 *)local_a0 = local_18;
      *(undefined8 *)(local_a0 + 2) = uStack_10;
      local_a0 = local_a0 + 4;
      local_38 = in_stack_fffffffffffffee8;
      uStack_30 = CONCAT44(local_58,local_58);
      local_28 = uVar1;
      uStack_20 = in_stack_fffffffffffffee0;
    }
    for (; local_fc < local_84; local_fc = local_fc + 1) {
      *local_a0 = *local_a0 + local_58;
      local_a0 = local_a0 + 1;
    }
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    local_48 = local_58;
  }
  return 0;
}

Assistant:

int Bias_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}